

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simg2img.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int __fd;
  int __fd_00;
  int iVar1;
  long lVar2;
  __off_t _Var3;
  char *__format;
  size_t __size;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (argc < 3) {
    usage();
  }
  else {
    uVar6 = (ulong)(argc - 1);
    __fd = open(argv[uVar6],0x241,0x1b4);
    if (__fd < 0) {
      pcVar4 = argv[uVar6];
      __format = "Cannot open output file %s\n";
LAB_0010123d:
      fprintf(_stderr,__format,pcVar4);
    }
    else {
      uVar5 = 1;
      while( true ) {
        pcVar4 = argv[uVar5];
        if ((*pcVar4 == '-') && (pcVar4[1] == '\0')) {
          __fd_00 = 0;
        }
        else {
          __fd_00 = open(pcVar4,0);
          if (__fd_00 < 0) {
            pcVar4 = argv[uVar5];
            __format = "Cannot open input file %s\n";
            goto LAB_0010123d;
          }
        }
        lVar2 = sparse_file_import(__fd_00,1,0);
        if (lVar2 == 0) break;
        _Var3 = lseek(__fd,0,0);
        if (_Var3 == -1) {
          perror("lseek failed");
          exit(1);
        }
        iVar1 = sparse_file_write(lVar2,__fd,0,0,0);
        if (iVar1 < 0) {
          pcVar4 = "Cannot write output file\n";
          __size = 0x19;
          goto LAB_00101314;
        }
        sparse_file_destroy(lVar2);
        close(__fd_00);
        uVar5 = uVar5 + 1;
        if (uVar6 == uVar5) {
          close(__fd);
          exit(0);
        }
      }
      pcVar4 = "Failed to read sparse file\n";
      __size = 0x1b;
LAB_00101314:
      fwrite(pcVar4,__size,1,_stderr);
    }
  }
  exit(-1);
}

Assistant:

int main(int argc, char* argv[]) {
  int in;
  int out;
  int i;
  struct sparse_file* s;

  if (argc < 3) {
    usage();
    exit(-1);
  }

  out = open(argv[argc - 1], O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0664);
  if (out < 0) {
    fprintf(stderr, "Cannot open output file %s\n", argv[argc - 1]);
    exit(-1);
  }

  for (i = 1; i < argc - 1; i++) {
    if (strcmp(argv[i], "-") == 0) {
      in = STDIN_FILENO;
    } else {
      in = open(argv[i], O_RDONLY | O_BINARY);
      if (in < 0) {
        fprintf(stderr, "Cannot open input file %s\n", argv[i]);
        exit(-1);
      }
    }

    s = sparse_file_import(in, true, false);
    if (!s) {
      fprintf(stderr, "Failed to read sparse file\n");
      exit(-1);
    }

    if (lseek(out, 0, SEEK_SET) == -1) {
      perror("lseek failed");
      exit(EXIT_FAILURE);
    }

    if (sparse_file_write(s, out, false, false, false) < 0) {
      fprintf(stderr, "Cannot write output file\n");
      exit(-1);
    }
    sparse_file_destroy(s);
    close(in);
  }

  close(out);

  exit(0);
}